

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O0

void SequenceTask_DemoLDF::my_update_example_indicies
               (search *sch,bool param_2,example *ec,uint64_t mult_amount,uint64_t plus_amount)

{
  ulong *puVar1;
  bool bVar2;
  features *pfVar3;
  unsigned_long **ppuVar4;
  long in_RCX;
  undefined8 in_RDX;
  byte in_SIL;
  long in_R8;
  feature_index *idx;
  unsigned_long *__end2;
  unsigned_long *__begin2;
  v_array<unsigned_long> *__range2;
  features *fs;
  iterator __end1;
  iterator __begin1;
  example *__range1;
  size_t ss;
  example_predict *in_stack_ffffffffffffff80;
  ulong *local_70;
  iterator local_58;
  iterator local_48;
  undefined8 local_38;
  size_t local_30;
  long local_28;
  long local_20;
  undefined8 local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_30 = Search::search::get_stride_shift((search *)0x3c0b14);
  local_38 = local_18;
  local_48 = example_predict::begin(in_stack_ffffffffffffff80);
  local_58 = example_predict::end(in_stack_ffffffffffffff80);
  while( true ) {
    bVar2 = example_predict::iterator::operator!=(&local_48,&local_58);
    if (!bVar2) break;
    pfVar3 = example_predict::iterator::operator*(&local_48);
    ppuVar4 = v_array<unsigned_long>::begin(&pfVar3->indicies);
    local_70 = *ppuVar4;
    ppuVar4 = v_array<unsigned_long>::end(&pfVar3->indicies);
    puVar1 = *ppuVar4;
    for (; local_70 != puVar1; local_70 = local_70 + 1) {
      *local_70 = (*local_70 >> ((byte)local_30 & 0x3f)) * local_20 + local_28 <<
                  ((byte)local_30 & 0x3f);
    }
    example_predict::iterator::operator++(&local_48);
  }
  return;
}

Assistant:

void my_update_example_indicies(
    Search::search& sch, bool /* audit */, example* ec, uint64_t mult_amount, uint64_t plus_amount)
{
  size_t ss = sch.get_stride_shift();
  for (features& fs : *ec)
    for (feature_index& idx : fs.indicies) idx = (((idx >> ss) * mult_amount) + plus_amount) << ss;
}